

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,size_t primID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  vfloat4 a0_1;
  float fVar13;
  float fVar14;
  vfloat4 a0;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar22 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vfloat4 a;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar21 [16];
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   primID * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>)
                                      .super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar7 + (uVar5 + 1) * sVar8);
  pfVar2 = (float *)(pcVar7 + (uVar5 + 2) * sVar8);
  fVar14 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar19 = *pfVar2 - *pfVar1;
  fVar23 = pfVar2[1] - pfVar1[1];
  fVar24 = pfVar2[2] - pfVar1[2];
  fVar26 = pfVar2[3] * fVar14 - pfVar1[3] * fVar14;
  fVar11 = fVar23 * fVar23;
  fVar12 = fVar24 * fVar24;
  fVar13 = fVar26 * fVar26;
  fVar29 = fVar11 + fVar19 * fVar19 + fVar12;
  auVar33._0_8_ = CONCAT44(fVar11 + fVar11 + fVar13,fVar29);
  auVar33._8_4_ = fVar11 + fVar12 + fVar12;
  auVar33._12_4_ = fVar11 + fVar13 + fVar13;
  auVar32._8_4_ = auVar33._8_4_;
  auVar32._0_8_ = auVar33._0_8_;
  auVar32._12_4_ = auVar33._12_4_;
  auVar33 = rsqrtss(auVar32,auVar33);
  fVar11 = auVar33._0_4_;
  fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar29 * 0.5 * fVar11;
  fVar19 = fVar11 * fVar19;
  fVar23 = fVar11 * fVar23;
  fVar24 = fVar11 * fVar24;
  fVar11 = fVar11 * fVar26;
  if (1e-18 < fVar29) {
    pfVar3 = (float *)(pcVar7 + uVar5 * sVar8);
    pfVar4 = (float *)(pcVar7 + (uVar5 + 3) * sVar8);
    fVar13 = (*pfVar1 * 0.0 + *pfVar2 * 0.5 + *pfVar4 * 0.0) - *pfVar3 * 0.5;
    fVar12 = (pfVar1[1] * 0.0 + pfVar2[1] * 0.5 + pfVar4[1] * 0.0) - pfVar3[1] * 0.5;
    fVar26 = (pfVar1[2] * 0.0 + pfVar2[2] * 0.5 + pfVar4[2] * 0.0) - pfVar3[2] * 0.5;
    fVar29 = (pfVar1[3] * fVar14 * 0.0 + pfVar2[3] * fVar14 * 0.5 + pfVar4[3] * fVar14 * 0.0) -
             pfVar3[3] * fVar14 * 0.5;
    fVar14 = fVar12 * fVar19 - fVar23 * fVar13;
    fVar12 = fVar26 * fVar23 - fVar24 * fVar12;
    fVar13 = fVar13 * fVar24 - fVar19 * fVar26;
    fVar26 = fVar29 * fVar11 - fVar11 * fVar29;
  }
  else {
    fVar12 = 0.0;
    fVar13 = 1.0;
    fVar14 = 0.0;
    fVar26 = 0.0;
    fVar19 = 0.0;
    fVar23 = 0.0;
    fVar24 = 1.0;
    fVar11 = 0.0;
  }
  fVar29 = fVar13 * fVar13;
  fVar15 = fVar14 * fVar14;
  fVar16 = fVar26 * fVar26;
  fVar20 = fVar29 + fVar12 * fVar12 + fVar15;
  auVar21._0_8_ = CONCAT44(fVar29 + fVar29 + fVar16,fVar20);
  auVar21._8_4_ = fVar29 + fVar15 + fVar15;
  auVar21._12_4_ = fVar29 + fVar16 + fVar16;
  if (fVar20 <= 1e-18) {
    fVar14 = -fVar23;
    fVar29 = -fVar24;
    auVar17._8_4_ = 0xffffffff;
    auVar17._0_8_ = 0xffffffffffffffff;
    if (fVar14 * fVar14 + fVar24 * fVar24 + 0.0 <= fVar19 * fVar19 + fVar29 * fVar29 + 0.0) {
      auVar17 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar15 = (float)((uint)fVar24 & auVar17._4_4_);
    fVar29 = (float)(~auVar17._0_4_ & (uint)fVar29);
    fVar20 = (float)(~auVar17._8_4_ & (uint)fVar19 | (uint)fVar14 & auVar17._8_4_);
    fVar14 = fVar15 * fVar15;
    fVar12 = fVar20 * fVar20;
    fVar13 = fVar14 + fVar29 * fVar29 + fVar12;
    auVar31._0_8_ = CONCAT44(fVar14 + fVar14 + 0.0,fVar13);
    auVar31._8_4_ = fVar14 + fVar12 + fVar12;
    auVar31._12_4_ = fVar14 + 0.0 + 0.0;
    auVar34._8_4_ = auVar31._8_4_;
    auVar34._0_8_ = auVar31._0_8_;
    auVar34._12_4_ = auVar31._12_4_;
    auVar33 = rsqrtss(auVar34,auVar31);
    fVar14 = auVar33._0_4_;
    fVar16 = fVar14 * 1.5 - fVar14 * fVar14 * fVar13 * 0.5 * fVar14;
    fVar29 = fVar16 * fVar29;
    fVar15 = fVar16 * fVar15;
    fVar20 = fVar16 * fVar20;
    fVar16 = fVar16 * 0.0;
    fVar14 = fVar15 * fVar19 - fVar23 * fVar29;
    fVar12 = fVar20 * fVar23 - fVar24 * fVar15;
    fVar13 = fVar29 * fVar24 - fVar19 * fVar20;
    fVar27 = fVar16 * fVar11 - fVar11 * fVar16;
    fVar26 = fVar12 * fVar12;
    fVar25 = fVar13 * fVar13;
    fVar28 = fVar27 * fVar27;
    fVar35 = fVar25 + fVar26 + fVar14 * fVar14;
    fVar36 = fVar28 + fVar26 + fVar26;
    fVar25 = fVar25 + fVar26 + fVar25;
    fVar28 = fVar28 + fVar26 + fVar28;
    auVar18._4_4_ = fVar36;
    auVar18._0_4_ = fVar35;
    auVar18._8_4_ = fVar25;
    auVar18._12_4_ = fVar28;
    auVar10._4_4_ = fVar36;
    auVar10._0_4_ = fVar35;
    auVar10._8_4_ = fVar25;
    auVar10._12_4_ = fVar28;
    auVar33 = rsqrtss(auVar18,auVar10);
    fVar26 = auVar33._0_4_;
    fVar26 = fVar26 * 1.5 - fVar26 * fVar26 * fVar35 * 0.5 * fVar26;
    fVar12 = fVar26 * fVar12;
    fVar13 = fVar26 * fVar13;
    fVar14 = fVar26 * fVar14;
    fVar26 = fVar26 * fVar27;
  }
  else {
    auVar30._8_4_ = auVar21._8_4_;
    auVar30._0_8_ = auVar21._0_8_;
    auVar30._12_4_ = auVar21._12_4_;
    auVar33 = rsqrtss(auVar30,auVar21);
    fVar29 = auVar33._0_4_;
    fVar29 = fVar29 * 1.5 - fVar29 * fVar29 * fVar20 * 0.5 * fVar29;
    fVar12 = fVar12 * fVar29;
    fVar13 = fVar13 * fVar29;
    fVar14 = fVar14 * fVar29;
    fVar26 = fVar26 * fVar29;
    fVar20 = fVar23 * fVar12 - fVar13 * fVar19;
    fVar29 = fVar24 * fVar13 - fVar14 * fVar23;
    fVar15 = fVar19 * fVar14 - fVar12 * fVar24;
    fVar27 = fVar11 * fVar26 - fVar26 * fVar11;
    fVar16 = fVar29 * fVar29;
    fVar25 = fVar15 * fVar15;
    fVar28 = fVar27 * fVar27;
    fVar35 = fVar25 + fVar16 + fVar20 * fVar20;
    fVar36 = fVar28 + fVar16 + fVar16;
    fVar25 = fVar25 + fVar16 + fVar25;
    fVar28 = fVar28 + fVar16 + fVar28;
    auVar22._4_4_ = fVar36;
    auVar22._0_4_ = fVar35;
    auVar22._8_4_ = fVar25;
    auVar22._12_4_ = fVar28;
    auVar9._4_4_ = fVar36;
    auVar9._0_4_ = fVar35;
    auVar9._8_4_ = fVar25;
    auVar9._12_4_ = fVar28;
    auVar33 = rsqrtss(auVar22,auVar9);
    fVar16 = auVar33._0_4_;
    fVar16 = fVar16 * 1.5 - fVar16 * fVar16 * fVar35 * 0.5 * fVar16;
    fVar29 = fVar16 * fVar29;
    fVar15 = fVar16 * fVar15;
    fVar20 = fVar16 * fVar20;
    fVar16 = fVar16 * fVar27;
  }
  (__return_storage_ptr__->vx).field_0.m128[0] = fVar29;
  (__return_storage_ptr__->vx).field_0.m128[1] = fVar15;
  (__return_storage_ptr__->vx).field_0.m128[2] = fVar20;
  (__return_storage_ptr__->vx).field_0.m128[3] = fVar16;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar12;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar13;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar14;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar26;
  (__return_storage_ptr__->vz).field_0.m128[0] = fVar19;
  (__return_storage_ptr__->vz).field_0.m128[1] = fVar23;
  (__return_storage_ptr__->vz).field_0.m128[2] = fVar24;
  (__return_storage_ptr__->vz).field_0.m128[3] = fVar11;
  return __return_storage_ptr__;
}

Assistant:

__forceinline const T& operator [](size_t i) const { assert(i<num); return *(T*)(ptr_ofs + i*stride); }